

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O0

int __thiscall MPEGStreamReader::bufFromNAL(MPEGStreamReader *this)

{
  MPEGStreamReader *this_local;
  
  if ((long)(this->super_AbstractStreamReader).m_bufEnd -
      (long)(this->super_AbstractStreamReader).m_curPos <
      (long)(int)(((this->m_longCodesAllowed & 1U) != 0) + 3)) {
    return 0;
  }
  if ((*(this->super_AbstractStreamReader).m_curPos == '\0') &&
     ((this->super_AbstractStreamReader).m_curPos[1] == '\0')) {
    if (((this->m_longCodesAllowed & 1U) != 0) &&
       (((this->super_AbstractStreamReader).m_curPos[2] == '\0' &&
        ((this->super_AbstractStreamReader).m_curPos[3] == '\x01')))) {
      return 4;
    }
    if ((this->super_AbstractStreamReader).m_curPos[2] == '\x01') {
      return 3;
    }
  }
  return 0;
}

Assistant:

int MPEGStreamReader::bufFromNAL() const
{
    if (m_bufEnd - m_curPos < (3 + (m_longCodesAllowed ? 1 : 0)))
        return 0;
    if (m_curPos[0] == 0 && m_curPos[1] == 0)
    {
        if (m_longCodesAllowed && m_curPos[2] == 0 && m_curPos[3] == 1)
            return 4;
        if (m_curPos[2] == 1)
            return 3;
    }
    return 0;
}